

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdcolmap.c
# Opt level: O0

int pbm_getc(FILE *infile)

{
  FILE *in_RDI;
  int ch;
  bool local_d;
  int local_c;
  
  local_c = getc(in_RDI);
  if (local_c == 0x23) {
    do {
      local_c = getc(in_RDI);
      local_d = local_c != 10 && local_c != -1;
    } while (local_d);
  }
  return local_c;
}

Assistant:

LOCAL(int)
pbm_getc(FILE *infile)
/* Read next char, skipping over any comments */
/* A comment/newline sequence is returned as a newline */
{
  register int ch;

  ch = getc(infile);
  if (ch == '#') {
    do {
      ch = getc(infile);
    } while (ch != '\n' && ch != EOF);
  }
  return ch;
}